

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_decode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                       opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_BOOL OVar4;
  opj_image_t *poVar5;
  long lVar6;
  
  if (p_image != (opj_image_t *)0x0) {
    OVar1 = (p_j2k->m_cp).m_specific_param.m_dec.m_reduce;
    if ((((OVar1 != 0) && (poVar5 = p_j2k->m_private_image, poVar5 != (opj_image_t *)0x0)) &&
        (poVar5->numcomps != 0)) &&
       (((poVar5->comps->factor == OVar1 && (uVar2 = p_image->numcomps, (ulong)uVar2 != 0)) &&
        ((poVar3 = p_image->comps, poVar3->factor == 0 && (poVar3->data == (OPJ_INT32 *)0x0)))))) {
      lVar6 = 0;
      do {
        *(OPJ_UINT32 *)((long)&poVar3->factor + lVar6) =
             (p_j2k->m_cp).m_specific_param.m_dec.m_reduce;
        lVar6 = lVar6 + 0x40;
      } while ((ulong)uVar2 << 6 != lVar6);
      OVar4 = opj_j2k_update_image_dimensions(p_image,p_manager);
      if (OVar4 == 0) {
        return 0;
      }
    }
    if (p_j2k->m_output_image == (opj_image_t *)0x0) {
      poVar5 = opj_image_create0();
      p_j2k->m_output_image = poVar5;
      if (poVar5 == (opj_image_t *)0x0) {
        return 0;
      }
    }
    opj_copy_image_header(p_image,p_j2k->m_output_image);
    if (p_j2k == (opj_j2k_t *)0x0) {
      __assert_fail("p_j2k != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x2a1d,"OPJ_BOOL opj_j2k_setup_decoding(opj_j2k_t *, opj_event_mgr_t *)");
    }
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x2a1e,"OPJ_BOOL opj_j2k_setup_decoding(opj_j2k_t *, opj_event_mgr_t *)");
    }
    OVar4 = opj_procedure_list_add_procedure(p_j2k->m_procedure_list,opj_j2k_decode_tiles,p_manager)
    ;
    if (OVar4 != 0) {
      OVar4 = opj_j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      if (OVar4 != 0) {
        OVar4 = opj_j2k_move_data_from_codec_to_output_image(p_j2k,p_image);
        return OVar4;
      }
      opj_image_destroy(p_j2k->m_private_image);
      p_j2k->m_private_image = (opj_image_t *)0x0;
    }
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_decode(opj_j2k_t * p_j2k,
                        opj_stream_private_t * p_stream,
                        opj_image_t * p_image,
                        opj_event_mgr_t * p_manager)
{
    if (!p_image) {
        return OPJ_FALSE;
    }

    /* Heuristics to detect sequence opj_read_header(), opj_set_decoded_resolution_factor() */
    /* and finally opj_decode_image() without manual setting of comps[].factor */
    /* We could potentially always execute it, if we don't allow people to do */
    /* opj_read_header(), modify x0,y0,x1,y1 of returned image an call opj_decode_image() */
    if (p_j2k->m_cp.m_specific_param.m_dec.m_reduce > 0 &&
            p_j2k->m_private_image != NULL &&
            p_j2k->m_private_image->numcomps > 0 &&
            p_j2k->m_private_image->comps[0].factor ==
            p_j2k->m_cp.m_specific_param.m_dec.m_reduce &&
            p_image->numcomps > 0 &&
            p_image->comps[0].factor == 0 &&
            /* Don't mess with image dimension if the user has allocated it */
            p_image->comps[0].data == NULL) {
        OPJ_UINT32 it_comp;

        /* Update the comps[].factor member of the output image with the one */
        /* of m_reduce */
        for (it_comp = 0; it_comp < p_image->numcomps; ++it_comp) {
            p_image->comps[it_comp].factor = p_j2k->m_cp.m_specific_param.m_dec.m_reduce;
        }
        if (!opj_j2k_update_image_dimensions(p_image, p_manager)) {
            return OPJ_FALSE;
        }
    }

    if (p_j2k->m_output_image == NULL) {
        p_j2k->m_output_image = opj_image_create0();
        if (!(p_j2k->m_output_image)) {
            return OPJ_FALSE;
        }
    }
    opj_copy_image_header(p_image, p_j2k->m_output_image);

    /* customization of the decoding */
    if (!opj_j2k_setup_decoding(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    /* Decode the codestream */
    if (! opj_j2k_exec(p_j2k, p_j2k->m_procedure_list, p_stream, p_manager)) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;
        return OPJ_FALSE;
    }

    /* Move data and copy one information from codec to output image*/
    return opj_j2k_move_data_from_codec_to_output_image(p_j2k, p_image);
}